

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_cpuid.hpp
# Opt level: O0

void __thiscall xsimd::detail::supported_arch::supported_arch(supported_arch *this)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  bool local_231;
  bool local_189;
  bool local_141;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98 [2];
  int regs7a [4];
  uint local_7c;
  int local_78;
  uint local_74;
  int regs7 [4];
  uint local_5c;
  int local_58 [2];
  int regs8 [4];
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  int local_28 [2];
  int regs1 [4];
  anon_class_1_0_00000001 get_cpuid;
  supported_arch *this_local;
  
  *this = (supported_arch)0x0;
  supported_arch::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)regs1 + 0xf),local_28,1,0);
  *(uint *)this = *(uint *)this & 0xfffffffe | (uint)regs1[1] >> 0x1a & 1;
  local_2c = sse2::version();
  local_2c = local_2c * (*(uint *)this & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_2c);
  this->best = *puVar3;
  *(uint *)this = (*(uint *)this & 0xfffffffd) + (regs1[0] & 1U) * 2;
  local_30 = sse3::version();
  local_30 = local_30 * (*(uint *)this >> 1 & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_30);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xfffffffb | (uint)regs1[0] >> 7 & 4;
  local_34 = ssse3::version();
  local_34 = local_34 * (*(uint *)this >> 2 & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_34);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xfffffff7 | (uint)regs1[0] >> 0x10 & 8;
  local_38 = sse4_1::version();
  local_38 = local_38 * (*(uint *)this >> 3 & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_38);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xffffffef | (uint)regs1[0] >> 0x10 & 0x10;
  local_3c = sse4_2::version();
  local_3c = local_3c * (*(uint *)this >> 4 & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_3c);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xffffffbf | (regs1[0] >> 0xc & 1U) << 6;
  if ((*(uint *)this >> 4 & 1) != 0) {
    local_40 = fma3<xsimd::sse4_2>::version();
    local_40 = local_40 * (*(uint *)this >> 6 & 1);
    puVar3 = std::max<unsigned_int>(&this->best,&local_40);
    this->best = *puVar3;
  }
  *(uint *)this = *(uint *)this & 0xfffffdff | (uint)regs1[0] >> 0x13 & 0x200;
  uVar1 = avx::version();
  regs8[3] = uVar1 * (*(uint *)this >> 9 & 1);
  puVar3 = std::max<unsigned_int>(&this->best,(uint *)(regs8 + 3));
  this->best = *puVar3;
  local_141 = false;
  if ((*(uint *)this >> 9 & 1) != 0) {
    local_141 = (*(uint *)this >> 6 & 1) != 0;
  }
  *(uint *)this = *(uint *)this & 0xfffffbff | (uint)local_141 << 10;
  uVar1 = fma3<xsimd::avx>::version();
  regs8[2] = uVar1 * (*(uint *)this >> 10 & 1);
  puVar3 = std::max<unsigned_int>(&this->best,(uint *)(regs8 + 2));
  this->best = *puVar3;
  supported_arch::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)regs1 + 0xf),local_58,-0x7fffffff,0);
  *(uint *)this = *(uint *)this & 0xffffff7f | (regs8[0]._2_2_ & 1) << 7;
  local_5c = fma4::version();
  local_5c = local_5c * (*(uint *)this >> 7 & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_5c);
  this->best = *puVar3;
  supported_arch::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)regs1 + 0xf),&local_78,7,0);
  *(uint *)this = *(uint *)this & 0xfffff7ff | (local_74 & 0x20) << 6;
  local_7c = avx2::version();
  local_7c = local_7c * (*(uint *)this >> 0xb & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_7c);
  this->best = *puVar3;
  supported_arch::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)regs1 + 0xf),(int *)local_98,7,1);
  *(uint *)this = *(uint *)this & 0xffffefff | (local_98[0] & 0x10) << 8;
  uVar1 = avxvnni::version();
  local_9c = uVar1 * (*(uint *)this >> 0xc & 1) * (*(uint *)this >> 0xb & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_9c);
  this->best = *puVar3;
  local_189 = false;
  if ((*(uint *)this >> 0xb & 1) != 0) {
    local_189 = (*(uint *)this >> 6 & 1) != 0;
  }
  *(uint *)this = *(uint *)this & 0xffffdfff | (uint)local_189 << 0xd;
  local_a0 = fma3<xsimd::avx2>::version();
  local_a0 = local_a0 * (*(uint *)this >> 0xd & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_a0);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xffffbfff | (local_74 >> 0x10 & 1) << 0xe;
  local_a4 = avx512f::version();
  local_a4 = local_a4 * (*(uint *)this >> 0xe & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_a4);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xffff7fff | local_74 >> 0xd & 0x8000;
  uVar1 = avx512cd::version();
  local_a8 = uVar1 * (*(uint *)this >> 0xf & 1) * (*(uint *)this >> 0xe & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_a8);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xfffeffff | local_74 >> 1 & 0x10000;
  uVar2 = avx512dq::version();
  uVar1 = *(uint *)this;
  local_ac = uVar2 * (uVar1 >> 0x10 & 1) * (uVar1 >> 0xf & 1) * (uVar1 >> 0xe & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_ac);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xfffdffff | local_74 >> 0xd & 0x20000;
  uVar2 = avx512bw::version();
  uVar1 = *(uint *)this;
  local_b0 = uVar2 * (uVar1 >> 0x11 & 1) * (uVar1 >> 0x10 & 1) * (uVar1 >> 0xf & 1) *
             (uVar1 >> 0xe & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_b0);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xfffbffff | local_74 >> 9 & 0x40000;
  uVar2 = avx512er::version();
  uVar1 = *(uint *)this;
  local_b4 = uVar2 * (uVar1 >> 0x12 & 1) * (uVar1 >> 0xf & 1) * (uVar1 >> 0xe & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_b4);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xfff7ffff | local_74 >> 7 & 0x80000;
  uVar2 = avx512pf::version();
  uVar1 = *(uint *)this;
  local_b8 = uVar2 * (uVar1 >> 0x13 & 1) * (uVar1 >> 0x12 & 1) * (uVar1 >> 0xf & 1) *
             (uVar1 >> 0xe & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_b8);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xffefffff | local_74 >> 1 & 0x100000;
  uVar2 = avx512ifma::version();
  uVar1 = *(uint *)this;
  local_bc = uVar2 * (uVar1 >> 0x14 & 1) * (uVar1 >> 0x11 & 1) * (uVar1 >> 0x10 & 1) *
             (uVar1 >> 0xf & 1) * (uVar1 >> 0xe & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_bc);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xffdfffff | (regs7[0] & 2U) << 0x14;
  uVar2 = avx512vbmi::version();
  uVar1 = *(uint *)this;
  local_c0 = uVar2 * (uVar1 >> 0x15 & 1) * (uVar1 >> 0x14 & 1) * (uVar1 >> 0x11 & 1) *
             (uVar1 >> 0x10 & 1) * (uVar1 >> 0xf & 1) * (uVar1 >> 0xe & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_c0);
  this->best = *puVar3;
  *(uint *)this = *(uint *)this & 0xffbfffff | (regs7[0] & 0x800U) << 0xb;
  uVar2 = avx512vnni<xsimd::avx512bw>::version();
  uVar1 = *(uint *)this;
  local_c4 = uVar2 * (uVar1 >> 0x16 & 1) * (uVar1 >> 0x11 & 1) * (uVar1 >> 0x10 & 1) *
             (uVar1 >> 0xf & 1) * (uVar1 >> 0xe & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_c4);
  this->best = *puVar3;
  local_231 = false;
  if ((*(uint *)this >> 0x15 & 1) != 0) {
    local_231 = (*(uint *)this >> 0x16 & 1) != 0;
  }
  *(uint *)this = *(uint *)this & 0xff7fffff | (uint)local_231 << 0x17;
  local_c8 = avx512vnni<xsimd::avx512vbmi>::version();
  local_c8 = local_c8 * (*(uint *)this >> 0x17 & 1);
  puVar3 = std::max<unsigned_int>(&this->best,&local_c8);
  this->best = *puVar3;
  return;
}

Assistant:

inline supported_arch() noexcept
            {
                memset(this, 0, sizeof(supported_arch));

#if defined(__aarch64__) || defined(_M_ARM64)
                neon = 1;
                neon64 = 1;
                best = neon64::version();
#elif defined(__ARM_NEON) || defined(_M_ARM)

#if defined(__linux__) && (!defined(__ANDROID_API__) || __ANDROID_API__ >= 18)
                neon = bool(getauxval(AT_HWCAP) & HWCAP_NEON);
#else
                // that's very conservative :-/
                neon = 0;
#endif
                neon64 = 0;
                best = neon::version() * neon;

#elif defined(__ARM_FEATURE_SVE) && defined(__ARM_FEATURE_SVE_BITS) && __ARM_FEATURE_SVE_BITS > 0

#if defined(__linux__) && (!defined(__ANDROID_API__) || __ANDROID_API__ >= 18)
                sve = bool(getauxval(AT_HWCAP) & HWCAP_SVE);
#else
                sve = 0;
#endif
                best = sve::version() * sve;

#elif defined(__riscv_vector) && defined(__riscv_v_fixed_vlen) && __riscv_v_fixed_vlen > 0

#if defined(__linux__) && (!defined(__ANDROID_API__) || __ANDROID_API__ >= 18)
#ifndef HWCAP_V
#define HWCAP_V (1 << ('V' - 'A'))
#endif
                rvv = bool(getauxval(AT_HWCAP) & HWCAP_V);
#else
                rvv = 0;
#endif

                best = ::xsimd::rvv::version() * rvv;
#elif defined(__x86_64__) || defined(__i386__) || defined(_M_AMD64) || defined(_M_IX86)
                auto get_cpuid = [](int reg[4], int level, int count = 0) noexcept
                {

#if defined(_MSC_VER)
                    __cpuidex(reg, level, count);

#elif defined(__INTEL_COMPILER)
                    __cpuid(reg, level);

#elif defined(__GNUC__) || defined(__clang__)

#if defined(__i386__) && defined(__PIC__)
                    // %ebx may be the PIC register
                    __asm__("xchg{l}\t{%%}ebx, %1\n\t"
                            "cpuid\n\t"
                            "xchg{l}\t{%%}ebx, %1\n\t"
                            : "=a"(reg[0]), "=r"(reg[1]), "=c"(reg[2]),
                              "=d"(reg[3])
                            : "0"(level), "2"(count));

#else
                    __asm__("cpuid\n\t"
                            : "=a"(reg[0]), "=b"(reg[1]), "=c"(reg[2]),
                              "=d"(reg[3])
                            : "0"(level), "2"(count));
#endif

#else
#error "Unsupported configuration"
#endif
                };

                int regs1[4];

                get_cpuid(regs1, 0x1);

                sse2 = regs1[3] >> 26 & 1;
                best = std::max(best, sse2::version() * sse2);

                sse3 = regs1[2] >> 0 & 1;
                best = std::max(best, sse3::version() * sse3);

                ssse3 = regs1[2] >> 9 & 1;
                best = std::max(best, ssse3::version() * ssse3);

                sse4_1 = regs1[2] >> 19 & 1;
                best = std::max(best, sse4_1::version() * sse4_1);

                sse4_2 = regs1[2] >> 20 & 1;
                best = std::max(best, sse4_2::version() * sse4_2);

                fma3_sse = regs1[2] >> 12 & 1;
                if (sse4_2)
                    best = std::max(best, fma3<xsimd::sse4_2>::version() * fma3_sse);

                avx = regs1[2] >> 28 & 1;
                best = std::max(best, avx::version() * avx);

                fma3_avx = avx && fma3_sse;
                best = std::max(best, fma3<xsimd::avx>::version() * fma3_avx);

                int regs8[4];
                get_cpuid(regs8, 0x80000001);
                fma4 = regs8[2] >> 16 & 1;
                best = std::max(best, fma4::version() * fma4);

                // sse4a = regs[2] >> 6 & 1;
                // best = std::max(best, XSIMD_X86_AMD_SSE4A_VERSION * sse4a);

                // xop = regs[2] >> 11 & 1;
                // best = std::max(best, XSIMD_X86_AMD_XOP_VERSION * xop);

                int regs7[4];
                get_cpuid(regs7, 0x7);
                avx2 = regs7[1] >> 5 & 1;
                best = std::max(best, avx2::version() * avx2);

                int regs7a[4];
                get_cpuid(regs7a, 0x7, 0x1);
                avxvnni = regs7a[0] >> 4 & 1;
                best = std::max(best, avxvnni::version() * avxvnni * avx2);

                fma3_avx2 = avx2 && fma3_sse;
                best = std::max(best, fma3<xsimd::avx2>::version() * fma3_avx2);

                avx512f = regs7[1] >> 16 & 1;
                best = std::max(best, avx512f::version() * avx512f);

                avx512cd = regs7[1] >> 28 & 1;
                best = std::max(best, avx512cd::version() * avx512cd * avx512f);

                avx512dq = regs7[1] >> 17 & 1;
                best = std::max(best, avx512dq::version() * avx512dq * avx512cd * avx512f);

                avx512bw = regs7[1] >> 30 & 1;
                best = std::max(best, avx512bw::version() * avx512bw * avx512dq * avx512cd * avx512f);

                avx512er = regs7[1] >> 27 & 1;
                best = std::max(best, avx512er::version() * avx512er * avx512cd * avx512f);

                avx512pf = regs7[1] >> 26 & 1;
                best = std::max(best, avx512pf::version() * avx512pf * avx512er * avx512cd * avx512f);

                avx512ifma = regs7[1] >> 21 & 1;
                best = std::max(best, avx512ifma::version() * avx512ifma * avx512bw * avx512dq * avx512cd * avx512f);

                avx512vbmi = regs7[2] >> 1 & 1;
                best = std::max(best, avx512vbmi::version() * avx512vbmi * avx512ifma * avx512bw * avx512dq * avx512cd * avx512f);

                avx512vnni_bw = regs7[2] >> 11 & 1;
                best = std::max(best, avx512vnni<xsimd::avx512bw>::version() * avx512vnni_bw * avx512bw * avx512dq * avx512cd * avx512f);

                avx512vnni_vbmi = avx512vbmi && avx512vnni_bw;
                best = std::max(best, avx512vnni<xsimd::avx512vbmi>::version() * avx512vnni_vbmi);
#endif
            }